

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O0

void __thiscall
GeneralHash<0,_unsigned_int,_unsigned_char>::GeneralHash
          (GeneralHash<0,_unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint maxval;
  ostream *poVar1;
  allocator<unsigned_int> local_19;
  int local_18;
  int local_14;
  int mywordsize_local;
  int myn_local;
  GeneralHash<0,_unsigned_int,_unsigned_char> *this_local;
  
  this->hashvalue = 0;
  this->wordsize = mywordsize;
  this->n = myn;
  this->irreduciblepoly = 0;
  local_18 = mywordsize;
  local_14 = myn;
  _mywordsize_local = this;
  maxval = maskfnc<unsigned_int>(this->wordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,maxval);
  this->lastbit = 1 << ((byte)this->wordsize & 0x1f);
  std::allocator<unsigned_int>::allocator(&local_19);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->precomputedshift,0,&local_19);
  std::allocator<unsigned_int>::~allocator(&local_19);
  if (this->wordsize == 0x13) {
    this->irreduciblepoly = 0x80027;
  }
  else if (this->wordsize == 9) {
    this->irreduciblepoly = 0x22d;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"unsupported wordsize ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->wordsize);
    poVar1 = std::operator<<(poVar1," bits, try 19 or 9");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

GeneralHash(int myn, int mywordsize = 19)
      : hashvalue(0), wordsize(mywordsize), n(myn), irreduciblepoly(0),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        lastbit(static_cast<hashvaluetype>(1) << wordsize),
        precomputedshift(precomputationtype == FULLPRECOMP ? (1 << n) : 0) {
    if (wordsize == 19) {
      irreduciblepoly = 1 + (1 << 1) + (1 << 2) + (1 << 5) + (1 << 19);
    } else if (wordsize == 9) {
      irreduciblepoly = 1 + (1 << 2) + (1 << 3) + (1 << 5) + (1 << 9);
    } else {
      cerr << "unsupported wordsize " << wordsize << " bits, try 19 or 9"
           << endl;
    }
    // in case the precomp is activated at the template level
    if (precomputationtype == FULLPRECOMP) {
      for (hashvaluetype x = 0; x < precomputedshift.size(); ++x) {
        hashvaluetype leftover = x << (wordsize - n);
        fastleftshift(leftover, n);
        precomputedshift[x] = leftover;
      }
    }
  }